

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.cxx
# Opt level: O0

cmDefinitions *
cmDefinitions::MakeClosure(cmDefinitions *__return_storage_ptr__,StackIter begin,StackIter end)

{
  bool bVar1;
  PointerType this;
  pair<std::__detail::_Node_iterator<std::pair<const_cm::String,_cmDefinitions::Def>,_false,_false>,_bool>
  pVar2;
  bool local_151;
  string_view local_118;
  _Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false> local_108;
  undefined1 local_100;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_f8;
  string_view local_f0;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_e0;
  _Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false> local_d8;
  _Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false> local_d0;
  reference local_c8;
  pair<const_cm::String,_cmDefinitions::Def> *mi;
  iterator __end2;
  iterator __begin2;
  unordered_map<cm::String,_cmDefinitions::Def,_std::hash<cm::String>,_std::equal_to<cm::String>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>_>
  *__range2;
  undefined1 local_80 [8];
  StackIter it;
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  undefined;
  StackIter end_local;
  StackIter begin_local;
  cmDefinitions *closure;
  
  cmDefinitions(__return_storage_ptr__);
  std::
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::unordered_set((unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)&it.Position);
  local_80 = (undefined1  [8])begin.Tree;
  it.Tree = (cmLinkedTree<cmDefinitions> *)begin.Position;
  while (bVar1 = cmLinkedTree<cmDefinitions>::iterator::operator!=((iterator *)local_80,end), bVar1)
  {
    this = cmLinkedTree<cmDefinitions>::iterator::operator->((iterator *)local_80);
    __end2 = std::
             unordered_map<cm::String,_cmDefinitions::Def,_std::hash<cm::String>,_std::equal_to<cm::String>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>_>
             ::begin(&this->Map);
    mi = (pair<const_cm::String,_cmDefinitions::Def> *)
         std::
         unordered_map<cm::String,_cmDefinitions::Def,_std::hash<cm::String>,_std::equal_to<cm::String>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>_>
         ::end(&this->Map);
    while (bVar1 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false>
                              ,(_Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false>
                                *)&mi), bVar1) {
      local_c8 = std::__detail::
                 _Node_iterator<std::pair<const_cm::String,_cmDefinitions::Def>,_false,_false>::
                 operator*(&__end2);
      local_d0._M_cur =
           (__node_type *)
           std::
           unordered_map<cm::String,_cmDefinitions::Def,_std::hash<cm::String>,_std::equal_to<cm::String>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>_>
           ::find(&__return_storage_ptr__->Map,&local_c8->first);
      local_d8._M_cur =
           (__node_type *)
           std::
           unordered_map<cm::String,_cmDefinitions::Def,_std::hash<cm::String>,_std::equal_to<cm::String>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>_>
           ::end(&__return_storage_ptr__->Map);
      bVar1 = std::__detail::operator==(&local_d0,&local_d8);
      local_151 = false;
      if (bVar1) {
        local_f0 = ::cm::String::view(&local_c8->first);
        local_e0._M_cur =
             (__node_type *)
             std::
             unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::find((unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)&it.Position,&local_f0);
        local_f8._M_cur =
             (__node_type *)
             std::
             unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::end((unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)&it.Position);
        local_151 = std::__detail::operator==(&local_e0,&local_f8);
      }
      if (local_151 != false) {
        bVar1 = ::cm::String::operator_cast_to_bool(&(local_c8->second).Value);
        if (bVar1) {
          pVar2 = std::
                  unordered_map<cm::String,_cmDefinitions::Def,_std::hash<cm::String>,_std::equal_to<cm::String>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>_>
                  ::insert(&__return_storage_ptr__->Map,local_c8);
          local_108._M_cur =
               (__node_type *)
               pVar2.first.
               super__Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false>.
               _M_cur;
          local_100 = pVar2.second;
        }
        else {
          local_118 = ::cm::String::view(&local_c8->first);
          std::
          unordered_set<std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::emplace<std::basic_string_view<char,std::char_traits<char>>>
                    ((unordered_set<std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)&it.Position,&local_118);
        }
      }
      std::__detail::_Node_iterator<std::pair<const_cm::String,_cmDefinitions::Def>,_false,_false>::
      operator++(&__end2);
    }
    cmLinkedTree<cmDefinitions>::iterator::operator++((iterator *)local_80);
  }
  std::
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~unordered_set((unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)&it.Position);
  return __return_storage_ptr__;
}

Assistant:

cmDefinitions cmDefinitions::MakeClosure(StackIter begin, StackIter end)
{
  cmDefinitions closure;
  std::unordered_set<cm::string_view> undefined;
  for (StackIter it = begin; it != end; ++it) {
    // Consider local definitions.
    for (auto const& mi : it->Map) {
      // Use this key if it is not already set or unset.
      if (closure.Map.find(mi.first) == closure.Map.end() &&
          undefined.find(mi.first.view()) == undefined.end()) {
        if (mi.second.Value) {
          closure.Map.insert(mi);
        } else {
          undefined.emplace(mi.first.view());
        }
      }
    }
  }
  return closure;
}